

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher.c
# Opt level: O2

int mbedtls_cipher_crypt
              (mbedtls_cipher_context_t *ctx,uchar *iv,size_t iv_len,uchar *input,size_t ilen,
              uchar *output,size_t *olen)

{
  int iVar1;
  size_t local_30;
  
  iVar1 = mbedtls_cipher_set_iv(ctx,iv,iv_len);
  if (((iVar1 == 0) && (iVar1 = -0x6100, ctx != (mbedtls_cipher_context_t *)0x0)) &&
     (ctx->cipher_info != (mbedtls_cipher_info_t *)0x0)) {
    ctx->unprocessed_len = 0;
    iVar1 = mbedtls_cipher_update(ctx,input,ilen,output,olen);
    if (iVar1 == 0) {
      iVar1 = mbedtls_cipher_finish(ctx,output + *olen,&local_30);
      if (iVar1 == 0) {
        *olen = *olen + local_30;
        iVar1 = 0;
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_cipher_crypt( mbedtls_cipher_context_t *ctx,
                  const unsigned char *iv, size_t iv_len,
                  const unsigned char *input, size_t ilen,
                  unsigned char *output, size_t *olen )
{
    int ret;
    size_t finish_olen;

    if( ( ret = mbedtls_cipher_set_iv( ctx, iv, iv_len ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_reset( ctx ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_update( ctx, input, ilen, output, olen ) ) != 0 )
        return( ret );

    if( ( ret = mbedtls_cipher_finish( ctx, output + *olen, &finish_olen ) ) != 0 )
        return( ret );

    *olen += finish_olen;

    return( 0 );
}